

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall dlib::image_display::on_wheel_down(image_display *this,unsigned_long state)

{
  bool bVar1;
  long *plVar2;
  ulong in_RSI;
  scrollable_region *in_RDI;
  point delta_1;
  point pix_loc_1;
  point mouse_loc_1;
  point delta;
  point pix_loc;
  point mouse_loc;
  scrollable_region *in_stack_fffffffffffffea0;
  rectangle *in_stack_fffffffffffffea8;
  vector<long,_2L> *in_stack_fffffffffffffeb0;
  point *in_stack_fffffffffffffeb8;
  rectangle *in_stack_fffffffffffffec0;
  unsigned_long in_stack_fffffffffffffef0;
  unsigned_long in_stack_fffffffffffffef8;
  scrollable_region *in_stack_ffffffffffffff00;
  long local_c0;
  long local_b8 [8];
  rectangle *in_stack_ffffffffffffff88;
  scrollable_region *in_stack_ffffffffffffff90;
  
  if ((in_RDI[1].total_rect_.b & 1) == 0) {
    if ((in_RSI & 0x10) == 0) {
      scrollable_region::on_wheel_down(in_stack_fffffffffffffea0,(unsigned_long)in_RDI);
    }
    else {
      bVar1 = rectangle::contains(&(in_RDI->super_drawable).rect,*(in_RDI->super_drawable).lastx,
                                  *(in_RDI->super_drawable).lasty);
      if (((bVar1) && (((in_RDI->super_drawable).hidden & 1U) == 0)) &&
         (((in_RDI->super_drawable).enabled & 1U) != 0)) {
        if (in_RDI[1].total_rect_.t == 1) {
          local_b8[0] = array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                        ::nr((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                              *)(in_RDI + 1));
          local_c0 = array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                     ::nc((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                           *)(in_RDI + 1));
          plVar2 = std::max<long>(local_b8,&local_c0);
          if (10 < *plVar2 / in_RDI[1].total_rect_.r) {
            vector<long,_2L>::vector
                      (in_stack_fffffffffffffeb0,(long)in_stack_fffffffffffffea8,
                       (long)in_stack_fffffffffffffea0);
            scrollable_region::total_rect(in_RDI);
            rectangle::tl_corner(in_stack_fffffffffffffea8);
            dlib::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            dlib::operator*((vector<long,_2L> *)in_stack_fffffffffffffea8,
                            (long *)in_stack_fffffffffffffea0);
            in_RDI[1].total_rect_.r = (in_RDI[1].total_rect_.r * 10) / 9 + 1;
            array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nc
                      ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                        *)(in_RDI + 1));
            array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nr
                      ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                        *)(in_RDI + 1));
            scrollable_region::set_total_rect_size
                      (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0
                      );
            scrollable_region::total_rect(in_RDI);
            rectangle::tl_corner(in_stack_fffffffffffffea8);
            vector<long,2l>::operator/
                      ((vector<long,_2L> *)in_stack_fffffffffffffea8,
                       (long *)in_stack_fffffffffffffea0);
            dlib::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            dlib::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            scrollable_region::display_rect(in_RDI);
            translate_rect(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            scrollable_region::scroll_to_rect(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          }
        }
        else {
          vector<long,_2L>::vector
                    (in_stack_fffffffffffffeb0,(long)in_stack_fffffffffffffea8,
                     (long)in_stack_fffffffffffffea0);
          scrollable_region::total_rect(in_RDI);
          rectangle::tl_corner(in_stack_fffffffffffffea8);
          dlib::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          vector<long,2l>::operator/
                    ((vector<long,_2L> *)in_stack_fffffffffffffea8,(long *)in_stack_fffffffffffffea0
                    );
          in_RDI[1].total_rect_.t = (in_RDI[1].total_rect_.t * 9) / 10;
          if (in_RDI[1].total_rect_.t == 0) {
            in_RDI[1].total_rect_.t = 1;
          }
          array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nc
                    ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 1));
          array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::nr
                    ((array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>
                      *)(in_RDI + 1));
          scrollable_region::set_total_rect_size
                    (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          scrollable_region::total_rect(in_RDI);
          rectangle::tl_corner(in_stack_fffffffffffffea8);
          dlib::operator*((vector<long,_2L> *)in_stack_fffffffffffffea8,
                          (long *)in_stack_fffffffffffffea0);
          dlib::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          dlib::operator-(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          scrollable_region::display_rect(in_RDI);
          translate_rect(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          scrollable_region::scroll_to_rect(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
      }
    }
  }
  return;
}

Assistant:

void image_display::
    on_wheel_down (
        unsigned long state
    )
    {
        // disable mouse wheel if the user is drawing a rectangle
        if (drawing_rect)
            return;

        // if CONTROL is not being held down
        if ((state & base_window::CONTROL) == 0)
        {
            scrollable_region::on_wheel_down(state);
            return;
        }

        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;


        if (zoom_in_scale != 1)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())/zoom_in_scale;

            zoom_in_scale = zoom_in_scale*9/10;
            if (zoom_in_scale == 0)
                zoom_in_scale = 1;

            set_total_rect_size(img.nc()*zoom_in_scale, img.nr()*zoom_in_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc*zoom_in_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
        else if (std::max(img.nr(), img.nc())/zoom_out_scale > 10)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())*zoom_out_scale;

            zoom_out_scale = zoom_out_scale*10/9 + 1;

            set_total_rect_size(img.nc()/zoom_out_scale, img.nr()/zoom_out_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc/zoom_out_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
    }